

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmSystemTools.cxx
# Opt level: O3

void cmSystemTools::Message(char *m1,char *title)

{
  size_t sVar1;
  
  if (s_DisableMessages) {
    return;
  }
  if (s_MessageCallback != (MessageCallback)0x0) {
    (*s_MessageCallback)(m1,title,&s_DisableMessages,s_MessageCallbackClientData);
    return;
  }
  if (m1 == (char *)0x0) {
    std::ios::clear((int)*(undefined8 *)(std::cerr + -0x18) + 0x69e270);
  }
  else {
    sVar1 = strlen(m1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,m1,sVar1);
  }
  std::ios::widen((char)*(undefined8 *)(std::cerr + -0x18) + 'p');
  std::ostream::put('p');
  std::ostream::flush();
  std::ostream::flush();
  return;
}

Assistant:

void cmSystemTools::Message(const char* m1, const char* title)
{
  if (s_DisableMessages) {
    return;
  }
  if (s_MessageCallback) {
    (*s_MessageCallback)(m1, title, s_DisableMessages,
                         s_MessageCallbackClientData);
    return;
  }
  std::cerr << m1 << std::endl << std::flush;
}